

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slot_Machine.cpp
# Opt level: O2

int main(void)

{
  double credits;
  SelectGame selectgame;
  double local_30;
  SelectGame local_28;
  
  local_30 = 0.0;
  SelectGame::SelectGame(&local_28);
  SelectGame::selectGame_Welcome(&local_28);
  SelectGame::selectGame_Games(&local_28);
  SelectGame::selectGame_Option(&local_28,&local_30);
  SelectGame::~SelectGame(&local_28);
  return 0;
}

Assistant:

int main()
{
    double credits = 0;
    //select Game
    SelectGame selectgame;
    selectgame.selectGame_Welcome();
    selectgame.selectGame_Games();
    //choosing a game
    selectgame.selectGame_Option(credits);
}